

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVectorBase<slang::IntervalMapDetails::NodeRef>::swap
          (SmallVectorBase<slang::IntervalMapDetails::NodeRef> *this,
          SmallVectorBase<slang::IntervalMapDetails::NodeRef> *rhs)

{
  size_type sVar1;
  pointer pNVar2;
  uintptr_t uVar3;
  NodeRef *__tmp;
  ulong uVar4;
  pointer pNVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  bool bVar9;
  
  if (this != rhs) {
    pNVar5 = this->data_;
    if ((pNVar5 == (pointer)this->firstElement) || (rhs->data_ == (pointer)rhs->firstElement)) {
      reserve(this,rhs->len);
      reserve(rhs,this->len);
      uVar7 = this->len;
      uVar6 = rhs->len;
      uVar4 = uVar7;
      if (uVar6 < uVar7) {
        uVar4 = uVar6;
      }
      if (uVar4 != 0) {
        pNVar5 = this->data_;
        pNVar2 = rhs->data_;
        uVar7 = 0;
        do {
          uVar3 = pNVar5[uVar7].pip.value;
          pNVar5[uVar7].pip.value = pNVar2[uVar7].pip.value;
          pNVar2[uVar7].pip.value = uVar3;
          uVar7 = uVar7 + 1;
        } while (uVar4 != uVar7);
        uVar7 = this->len;
        uVar6 = rhs->len;
      }
      if (uVar6 < uVar7) {
        pNVar5 = rhs->data_ + uVar6;
        if (pNVar5 != pNVar5 + (uVar7 - uVar4) && uVar4 != uVar7) {
          pNVar2 = this->data_;
          lVar8 = 0;
          do {
            *(undefined8 *)((long)&(pNVar5->pip).value + lVar8) =
                 *(undefined8 *)((long)&pNVar2[uVar4].pip.value + lVar8);
            bVar9 = uVar7 * 8 + uVar4 * -8 + -8 == lVar8;
            if (bVar9) break;
            lVar8 = lVar8 + 8;
          } while (!bVar9);
          uVar7 = this->len;
        }
        rhs->len = uVar7;
        this->len = uVar4;
      }
      else if (uVar7 < uVar6) {
        pNVar5 = this->data_ + uVar7;
        if (pNVar5 != pNVar5 + (uVar6 - uVar4) && uVar4 != uVar6) {
          pNVar2 = rhs->data_;
          lVar8 = 0;
          do {
            *(undefined8 *)((long)&(pNVar5->pip).value + lVar8) =
                 *(undefined8 *)((long)&pNVar2[uVar4].pip.value + lVar8);
            bVar9 = uVar6 * 8 + uVar4 * -8 + -8 == lVar8;
            if (bVar9) break;
            lVar8 = lVar8 + 8;
          } while (!bVar9);
          uVar6 = rhs->len;
        }
        this->len = uVar6;
        rhs->len = uVar4;
      }
    }
    else {
      this->data_ = rhs->data_;
      rhs->data_ = pNVar5;
      sVar1 = this->len;
      this->len = rhs->len;
      rhs->len = sVar1;
      sVar1 = this->cap;
      this->cap = rhs->cap;
      rhs->cap = sVar1;
    }
  }
  return;
}

Assistant:

void SmallVectorBase<T>::swap(SmallVectorBase<T>& rhs) {
    if (this == &rhs)
        return;

    // We can only do a true swap if neither vector is small.
    if (!isSmall() && !rhs.isSmall()) {
        std::swap(data_, rhs.data_);
        std::swap(len, rhs.len);
        std::swap(cap, rhs.cap);
        return;
    }

    // Make sure each container has enough space for each other's elements.
    reserve(rhs.size());
    rhs.reserve(size());

    // Swap the shared elements.
    size_type numShared = std::min(size(), rhs.size());
    for (size_type i = 0; i < numShared; i++)
        std::swap((*this)[i], rhs[i]);

    // Copy over the extra elements from whichever side is larger.
    if (size() > rhs.size()) {
        std::ranges::uninitialized_copy(begin() + numShared, end(), rhs.end(),
                                        rhs.end() + size() - numShared);
        rhs.len = len;

        std::ranges::destroy(begin() + numShared, end());
        len = numShared;
    }
    else if (rhs.size() > size()) {
        std::ranges::uninitialized_copy(rhs.begin() + numShared, rhs.end(), end(),
                                        end() + rhs.size() - numShared);
        len = rhs.len;

        std::ranges::destroy(rhs.begin() + numShared, rhs.end());
        rhs.len = numShared;
    }
}